

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O3

char * json_serialize_to_string_pretty(JSON_Value *value)

{
  int iVar1;
  JSON_Status JVar2;
  char *buf;
  size_t buf_size_in_bytes;
  char num_buf [64];
  char acStack_58 [64];
  
  iVar1 = json_serialize_to_buffer_r(value,(char *)0x0,0,1,acStack_58);
  buf_size_in_bytes = (long)iVar1 + 1;
  if ((buf_size_in_bytes != 0 && -1 < iVar1) &&
     (buf = (char *)(*parson_malloc)(buf_size_in_bytes), buf != (char *)0x0)) {
    JVar2 = json_serialize_to_buffer_pretty(value,buf,buf_size_in_bytes);
    if (JVar2 == 0) {
      return buf;
    }
    (*parson_free)(buf);
  }
  return (char *)0x0;
}

Assistant:

char * json_serialize_to_string_pretty(const JSON_Value *value) {
    JSON_Status serialization_result = JSONFailure;
    size_t buf_size_bytes = json_serialization_size_pretty(value);
    char *buf = NULL;
    if (buf_size_bytes == 0) {
        return NULL;
    }
    buf = (char*)parson_malloc(buf_size_bytes);
    if (buf == NULL) {
        return NULL;
    }
    serialization_result = json_serialize_to_buffer_pretty(value, buf, buf_size_bytes);
    if (serialization_result != JSONSuccess) {
        json_free_serialized_string(buf);
        return NULL;
    }
    return buf;
}